

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

Option * __thiscall CLI::Option::capture_default_str(Option *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->default_function_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->default_function_)._M_invoker)(&local_30,(_Any_data *)&this->default_function_);
    ::std::__cxx11::string::operator=((string *)&this->default_str_,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

Option *capture_default_str() {
        if(default_function_) {
            default_str_ = default_function_();
        }
        return this;
    }